

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QScrollerPrivate::ScrollSegment>::reallocateAndGrow
          (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<QScrollerPrivate::ScrollSegment> *old)

{
  ScrollSegment *pSVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  ScrollSegment *pSVar4;
  bool bVar5;
  qint64 qVar6;
  qint64 qVar7;
  qreal qVar8;
  long lVar9;
  qsizetype qVar10;
  ScrollSegment *pSVar11;
  ScrollSegment *pSVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QArrayDataPointer<QScrollerPrivate::ScrollSegment> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar10 = 0;
        lVar9 = 0;
      }
      else {
        qVar10 = pQVar2->alloc;
        lVar9 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 6);
      }
      auVar13 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x40,qVar10 + n + lVar9,Grow);
      this->d = (Data *)auVar13._0_8_;
      this->ptr = (ScrollSegment *)auVar13._8_8_;
      goto LAB_0066ad34;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (ScrollSegment *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_58,this,n,where);
  pSVar4 = local_58.ptr;
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pSVar11 = this->ptr;
    pSVar12 = pSVar11 + lVar9;
    if ((old != (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0) || (bVar5)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          qVar6 = pSVar11->startTime;
          qVar7 = pSVar11->deltaTime;
          qVar8 = pSVar11->deltaPos;
          pSVar1 = pSVar4 + local_58.size;
          pSVar1->startPos = pSVar11->startPos;
          pSVar1->deltaPos = qVar8;
          pSVar1->startTime = qVar6;
          pSVar1->deltaTime = qVar7;
          QEasingCurve::QEasingCurve(&pSVar1->curve,&pSVar11->curve);
          pSVar1->type = pSVar11->type;
          qVar8 = pSVar11->stopPos;
          pSVar1->stopProgress = pSVar11->stopProgress;
          pSVar1->stopPos = qVar8;
          local_58.size = local_58.size + 1;
          pSVar11 = pSVar11 + 1;
        } while (pSVar11 < pSVar12);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      do {
        qVar6 = pSVar11->startTime;
        qVar7 = pSVar11->deltaTime;
        qVar8 = pSVar11->deltaPos;
        local_58.ptr[local_58.size].startPos = pSVar11->startPos;
        (&local_58.ptr[local_58.size].startPos)[1] = qVar8;
        local_58.ptr[local_58.size].startTime = qVar6;
        local_58.ptr[local_58.size].deltaTime = qVar7;
        local_58.ptr[local_58.size].curve.d_ptr = (pSVar11->curve).d_ptr;
        (pSVar11->curve).d_ptr = (QEasingCurvePrivate *)0x0;
        local_58.ptr[local_58.size].type = pSVar11->type;
        qVar8 = pSVar11->stopPos;
        local_58.ptr[local_58.size].stopProgress = pSVar11->stopProgress;
        (&local_58.ptr[local_58.size].stopProgress)[1] = qVar8;
        pSVar11 = pSVar11 + 1;
        local_58.size = local_58.size + 1;
      } while (pSVar11 < pSVar12);
    }
  }
  pDVar3 = this->d;
  pSVar4 = this->ptr;
  this->d = local_58.d;
  this->ptr = local_58.ptr;
  qVar10 = this->size;
  this->size = local_58.size;
  local_58.d = pDVar3;
  local_58.ptr = pSVar4;
  local_58.size = qVar10;
  if (old != (QArrayDataPointer<QScrollerPrivate::ScrollSegment> *)0x0) {
    local_58.d = old->d;
    local_58.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pSVar4;
    local_58.size = old->size;
    old->size = qVar10;
  }
  ~QArrayDataPointer(&local_58);
LAB_0066ad34:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }